

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctor.hpp
# Opt level: O2

void __thiscall
njoy::ENDFtk::record::IntegerBase<6U,_8U>::IntegerBase
          (IntegerBase<6U,_8U> *this,uint i,uint j,vector<int,_std::allocator<int>_> *k)

{
  pointer piVar1;
  
  this->i_ = i;
  this->j_ = j;
  piVar1 = (k->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  (this->k_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (k->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start
  ;
  (this->k_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = piVar1;
  (this->k_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (k->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  (k->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (k->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (k->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  verifySize((uint)((ulong)((long)(this->k_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_finish -
                           (long)(this->k_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start) >> 2));
  return;
}

Assistant:

IntegerBase( unsigned int i, unsigned int j, std::vector< int >&& k ) :
  i_( i ), j_( j ), k_( std::move( k ) ) {

    verifySize( this->k_.size() );
  }